

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GCSwitchfinder.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  ostream *poVar2;
  long in_RSI;
  string reference;
  string *in_stack_000001a8;
  string *in_stack_00000b70;
  string *in_stack_00000b78;
  string *in_stack_00000b80;
  allocator local_b1;
  string local_b0 [39];
  allocator local_89;
  string local_88 [55];
  allocator local_51;
  string local_50 [32];
  string local_30 [32];
  long local_10;
  
  local_10 = in_RSI;
  poVar2 = std::operator<<((ostream *)&std::cout,"Starting ");
  poVar2 = std::operator<<(poVar2,*(char **)(local_10 + 8));
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  pcVar1 = *(char **)(local_10 + 0x18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,pcVar1,&local_51);
  readReferenceFile(in_stack_000001a8);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  pcVar1 = *(char **)(local_10 + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,pcVar1,&local_89);
  pcVar1 = *(char **)(local_10 + 0x10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,pcVar1,&local_b1);
  findSwitches(in_stack_00000b80,in_stack_00000b78,in_stack_00000b70);
  std::__cxx11::string::~string(local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  poVar2 = std::operator<<((ostream *)&std::cout,"Ended");
  poVar2 = std::operator<<(poVar2,*(char **)(local_10 + 8));
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_30);
  return 0;
}

Assistant:

int main(int argc, char* argv[]) {
   
    cout << "Starting "<< argv[1] << endl;
    string reference = readReferenceFile(argv[3]);
    findSwitches(argv[1],argv[2],reference);
    //scoreIndividualReads();
    cout << "Ended"<< argv[1] << endl;


}